

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O3

void __thiscall
features::Sift::orientation_assignment
          (Sift *this,Keypoint *kp,Octave *octave,
          vector<float,_std::allocator<float>_> *orientations)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  iterator __position;
  float *pfVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  float *pfVar10;
  long lVar11;
  float fVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float local_128 [2];
  float hist [36];
  float local_74;
  float local_70;
  float o;
  float local_68;
  int local_64;
  Keypoint *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  int local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  memset(local_128,0,0x90);
  local_40 = kp->x + 0.5;
  local_38 = kp->y + 0.5;
  local_3c = kp->sample;
  local_60 = kp;
  if (local_3c <= 0.0) {
    fVar15 = ceilf(local_3c + -0.5);
  }
  else {
    fVar15 = floorf(local_3c + 0.5);
  }
  local_34 = (this->options).base_blur_sigma;
  fVar16 = exp2f((local_3c + 1.0) / (float)(this->options).num_samples_per_octave);
  lVar9 = (long)(int)fVar15 + 1;
  psVar1 = (octave->grad).
           super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = psVar1[lVar9].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = psVar1[lVar9].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  iVar5 = (int)local_40;
  psVar1 = (octave->ori).
           super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = psVar1[lVar9].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58 = psVar1[lVar9].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  fVar16 = local_34 * fVar16 * 1.5;
  fVar15 = (float)(int)(fVar16 * 3.0);
  if ((int)fVar15 <= iVar5) {
    local_44 = *(int *)((long)&peVar2->super_TypedImageBase<float> + 8);
    if ((int)fVar15 + iVar5 < local_44) {
      iVar8 = (int)local_38;
      if (((int)fVar15 <= iVar8) &&
         ((int)fVar15 + iVar8 < *(int *)((long)&peVar2->super_TypedImageBase<float> + 0xc))) {
        local_50 = this_00;
        if (-1 < (int)fVar15) {
          fVar18 = (float)((int)fVar15 * (int)fVar15) + 0.5;
          fVar20 = (float)iVar5 - local_60->x;
          local_68 = (float)iVar8 - local_60->y;
          local_60 = (Keypoint *)CONCAT44(local_60._4_4_,(fVar16 + fVar16) * fVar16);
          iVar5 = (iVar8 - (int)fVar15) * local_44 + iVar5;
          local_64 = (int)fVar15 * 2 + 1;
          o = (float)-(int)fVar15;
          local_38 = fVar18;
          local_70 = fVar20;
          fVar16 = (float)-(int)fVar15;
          do {
            fVar19 = ((float)(int)fVar16 + local_68) * ((float)(int)fVar16 + local_68);
            local_3c = fVar19;
            fVar12 = o;
            iVar8 = local_64;
            do {
              fVar17 = ((float)(int)fVar12 + fVar20) * ((float)(int)fVar12 + fVar20) + fVar19;
              if (fVar17 <= fVar18) {
                local_34 = *(float *)(*(long *)&((ImageData *)
                                                ((long)&peVar2->super_TypedImageBase<float> + 0x18))
                                                ->super__Vector_base<float,_std::allocator<float>_>
                                     + (long)(iVar5 + (int)fVar12) * 4);
                local_40 = *(float *)(*(long *)&((ImageData *)
                                                ((long)&peVar3->super_TypedImageBase<float> + 0x18))
                                                ->super__Vector_base<float,_std::allocator<float>_>
                                     + (long)(iVar5 + (int)fVar12) * 4);
                fVar17 = expf(-fVar17 / local_60._0_4_);
                fVar18 = local_38;
                fVar19 = local_3c;
                fVar20 = local_70;
                uVar6 = (uint)((local_40 * 36.0) / 6.2831855);
                if (0x22 < (int)uVar6) {
                  uVar6 = 0x23;
                }
                uVar7 = (ulong)uVar6;
                if ((int)uVar6 < 1) {
                  uVar7 = 0;
                }
                local_128[uVar7] = fVar17 * local_34 + local_128[uVar7];
              }
              fVar12 = (float)((int)fVar12 + 1);
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
            iVar5 = iVar5 + local_44;
            bVar14 = fVar16 != fVar15;
            fVar16 = (float)((int)fVar16 + 1);
          } while (bVar14);
        }
        this_00 = local_50;
        iVar5 = 0;
        pfVar10 = local_128;
        do {
          fVar15 = local_128[0];
          lVar9 = 1;
          fVar16 = local_128[0];
          fVar20 = hist[0x21];
          do {
            fVar18 = fVar16;
            pfVar4 = local_128 + lVar9;
            local_128[lVar9 + -1] = (fVar20 + fVar18 + *pfVar4) / 3.0;
            lVar9 = lVar9 + 1;
            fVar16 = *pfVar4;
            fVar20 = fVar18;
          } while (lVar9 != 0x24);
          hist[0x21] = (fVar15 + fVar18 + hist[0x21]) / 3.0;
          iVar5 = iVar5 + 1;
        } while (iVar5 != 6);
        lVar9 = 4;
        do {
          fVar15 = *(float *)((long)local_128 + lVar9);
          pfVar4 = (float *)((long)local_128 + lVar9);
          if (fVar15 <= local_128[0]) {
            fVar15 = local_128[0];
            pfVar4 = pfVar10;
          }
          pfVar10 = pfVar4;
          local_128[0] = fVar15;
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0x90);
        local_34 = *pfVar10 * 0.8;
        lVar9 = 0;
        do {
          uVar7 = (ulong)((int)lVar9 - 1);
          if (lVar9 == 0) {
            uVar7 = 0x23;
          }
          fVar15 = local_128[lVar9];
          lVar13 = lVar9 + 1;
          lVar11 = 0;
          if (lVar9 != 0x23) {
            lVar11 = lVar13;
          }
          if (((local_34 < fVar15) && (fVar16 = local_128[uVar7], fVar16 < fVar15)) &&
             (fVar20 = local_128[lVar11], fVar20 < fVar15)) {
            local_74 = ((((float)(int)lVar9 -
                         ((fVar20 - fVar16) * 0.5) / ((fVar16 - (fVar15 + fVar15)) + fVar20)) + 0.5)
                       * 6.2831855) / 36.0;
            __position._M_current =
                 (orientations->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (orientations->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)orientations,__position,&local_74);
            }
            else {
              *__position._M_current = local_74;
              (orientations->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
          lVar9 = lVar13;
        } while (lVar13 != 0x24);
      }
    }
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void
Sift::orientation_assignment (Keypoint const& kp,
    Octave const* octave, std::vector<float>& orientations)
{
    int const nbins = 36;
    float const nbinsf = static_cast<float>(nbins);

    /* Prepare 36-bin histogram. */
    float hist[nbins];
    std::fill(hist, hist + nbins, 0.0f);

    /* Integral x and y coordinates and closest scale sample. */
    int const ix = static_cast<int>(kp.x + 0.5f);
    int const iy = static_cast<int>(kp.y + 0.5f);
    int const is = static_cast<int>(math::round(kp.sample));
    float const sigma = this->keypoint_relative_scale(kp);

    /* Images with its dimension for the keypoint. */
    core::FloatImage::ConstPtr grad(octave->grad[is + 1]);
    core::FloatImage::ConstPtr ori(octave->ori[is + 1]);
    int const width = grad->width();
    int const height = grad->height();

    /*
     * Compute window size 'win', the full window has  2 * win + 1  pixel.
     * The factor 3 makes the window large enough such that the gaussian
     * has very little weight beyond the window. The value 1.5 is from
     * the SIFT paper. If the window goes beyond the image boundaries,
     * the keypoint is discarded.
     */
    float const sigma_factor = 1.5f;
    int win = static_cast<int>(sigma * sigma_factor * 3.0f);
    if (ix < win || ix + win >= width || iy < win || iy + win >= height)
        return;

    /* Center of keypoint index. */
    int center = iy * width + ix;
    float const dxf = kp.x - static_cast<float>(ix);
    float const dyf = kp.y - static_cast<float>(iy);
    float const maxdist = static_cast<float>(win*win) + 0.5f;

    /* Populate histogram over window, intersected with (1,1), (w-2,h-2). */
    for (int dy = -win; dy <= win; ++dy)
    {
        int const yoff = dy * width;
        for (int dx = -win; dx <= win; ++dx)
        {
            /* Limit to circular window (centered at accurate keypoint). */
            float const dist = MATH_POW2(dx-dxf) + MATH_POW2(dy-dyf);
            if (dist > maxdist)
                continue;

            float gm = grad->at(center + yoff + dx); // gradient magnitude
            float go = ori->at(center + yoff + dx); // gradient orientation
            float weight = math::gaussian_xx(dist, sigma * sigma_factor);
            int bin = static_cast<int>(nbinsf * go / (2.0f * MATH_PI));
            bin = math::clamp(bin, 0, nbins - 1);
            hist[bin] += gm * weight;
        }
    }

    /* Smooth histogram. */
    for (int i = 0; i < 6; ++i)
    {
        float first = hist[0];
        float prev = hist[nbins - 1];
        for (int j = 0; j < nbins - 1; ++j)
        {
            float current = hist[j];
            hist[j] = (prev + current + hist[j + 1]) / 3.0f;
            prev = current;
        }
        hist[nbins - 1] = (prev + hist[nbins - 1] + first) / 3.0f;
    }

    /* Find maximum element. */
    float maxh = *std::max_element(hist, hist + nbins);

    /* Find peaks within 80% of max element. */
    for (int i = 0; i < nbins; ++i)
    {
        float h0 = hist[(i + nbins - 1) % nbins];
        float h1 = hist[i];
        float h2 = hist[(i + 1) % nbins];

        /* These peaks must be a local maximum! */
        if (h1 <= 0.8f * maxh || h1 <= h0 || h1 <= h2)
            continue;

        /*
         * Quadratic interpolation to find accurate maximum.
         * f(x) = ax^2 + bx + c, f(-1) = h0, f(0) = h1, f(1) = h2
         * --> a = 1/2 (h0 - 2h1 + h2), b = 1/2 (h2 - h0), c = h1.
         * x = f'(x) = 2ax + b = 0 --> x = -1/2 * (h2 - h0) / (h0 - 2h1 + h2)
         */
        float x = -0.5f * (h2 - h0) / (h0 - 2.0f * h1 + h2);
        float o =  2.0f * MATH_PI * (x + (float)i + 0.5f) / nbinsf;
        orientations.push_back(o);
    }
}